

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int tinyexr::hufCompress(unsigned_short *raw,int nRaw,char *compressed)

{
  long *plVar1;
  char *pcVar2;
  long *plVar3;
  int i;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uchar *b;
  ulong uVar7;
  int iM;
  ulong uVar8;
  int iVar9;
  long lVar10;
  longlong freq [65537];
  char *tableEnd;
  int hlink [65537];
  longlong scode [65537];
  
  if (nRaw == 0) {
    iVar9 = 0;
  }
  else {
    countFrequencies(freq,raw,nRaw);
    uVar5 = 0xffffffffffffffff;
    plVar3 = (long *)&stack0xffffffffffe3ff90;
    do {
      uVar5 = uVar5 + 1;
      plVar1 = plVar3 + 1;
      plVar3 = plVar3 + 1;
    } while (*plVar1 == 0);
    uVar7 = 0;
    iVar9 = 0;
    for (uVar4 = uVar5; uVar4 < 0x10001; uVar4 = uVar4 + 1) {
      hlink[uVar4] = (int)uVar4;
      if (*plVar3 != 0) {
        (&tableEnd)[iVar9] = (char *)plVar3;
        iVar9 = iVar9 + 1;
        uVar7 = uVar4 & 0xffffffff;
      }
      plVar3 = plVar3 + 1;
    }
    iM = (int)uVar7 + 1;
    freq[(long)(int)uVar7 + 1] = 1;
    (&tableEnd)[iVar9] = (char *)(freq + (long)(int)uVar7 + 1);
    uVar4 = (ulong)(iVar9 + 1);
    std::make_heap<long_long**,tinyexr::FHeapCompare>(&tableEnd);
    memset(scode,0,0x80008);
    while (1 < (int)uVar4) {
      uVar7 = (long)tableEnd - (long)freq;
      std::pop_heap<long_long**,tinyexr::FHeapCompare>(&tableEnd,&tableEnd + uVar4);
      uVar8 = (ulong)((long)tableEnd - (long)freq) >> 3;
      lVar10 = uVar4 * 8;
      uVar4 = uVar4 - 1;
      std::pop_heap<long_long**,tinyexr::FHeapCompare>(&tableEnd,&stack0xffffffffffebffa0 + lVar10);
      uVar7 = uVar7 >> 3;
      freq[(int)uVar8] = freq[(int)uVar8] + freq[(int)uVar7];
      std::push_heap<long_long**,tinyexr::FHeapCompare>(&tableEnd,&stack0xffffffffffebffa0 + lVar10)
      ;
      do {
        uVar6 = (uint)uVar8;
        scode[(int)uVar6] = scode[(int)uVar6] + 1;
        uVar8 = (ulong)(uint)hlink[(int)uVar6];
      } while (hlink[(int)uVar6] != uVar6);
      hlink[(int)uVar6] = (int)uVar7;
      do {
        uVar6 = (uint)uVar7;
        scode[(int)uVar6] = scode[(int)uVar6] + 1;
        uVar7 = (ulong)(uint)hlink[(int)uVar6];
      } while (hlink[(int)uVar6] != uVar6);
    }
    hufCanonicalCodeTable(scode);
    memcpy(freq,scode,0x80008);
    tableEnd = compressed + 0x14;
    hufPackEncTable(freq,(int)uVar5,iM,&tableEnd);
    pcVar2 = tableEnd;
    lVar10 = (long)tableEnd - (long)(compressed + 0x14);
    iVar9 = hufEncode(freq,raw,nRaw,iM,tableEnd);
    *compressed = (char)uVar5;
    compressed[1] = (char)(uVar5 >> 8);
    compressed[2] = (char)(uVar5 >> 0x10);
    compressed[3] = (char)(uVar5 >> 0x18);
    compressed[4] = (char)iM;
    compressed[5] = (char)((uint)iM >> 8);
    compressed[6] = (char)((uint)iM >> 0x10);
    compressed[7] = (char)((uint)iM >> 0x18);
    compressed[8] = (char)lVar10;
    compressed[9] = (char)((ulong)lVar10 >> 8);
    compressed[10] = (char)((ulong)lVar10 >> 0x10);
    compressed[0xb] = (char)((ulong)lVar10 >> 0x18);
    compressed[0xc] = (char)iVar9;
    compressed[0xd] = (char)((uint)iVar9 >> 8);
    compressed[0xe] = (char)((uint)iVar9 >> 0x10);
    compressed[0xf] = (char)((uint)iVar9 >> 0x18);
    iVar9 = ((int)pcVar2 + (iVar9 + 7) / 8) - (int)compressed;
    compressed[0x10] = '\0';
    compressed[0x11] = '\0';
    compressed[0x12] = '\0';
    compressed[0x13] = '\0';
  }
  return iVar9;
}

Assistant:

int hufCompress(const unsigned short raw[], int nRaw, char compressed[]) {
  if (nRaw == 0) return 0;

  long long freq[HUF_ENCSIZE];

  countFrequencies(freq, raw, nRaw);

  int im = 0;
  int iM = 0;
  hufBuildEncTable(freq, &im, &iM);

  char *tableStart = compressed + 20;
  char *tableEnd = tableStart;
  hufPackEncTable(freq, im, iM, &tableEnd);
  int tableLength = tableEnd - tableStart;

  char *dataStart = tableEnd;
  int nBits = hufEncode(freq, raw, nRaw, iM, dataStart);
  int data_length = (nBits + 7) / 8;

  writeUInt(compressed, im);
  writeUInt(compressed + 4, iM);
  writeUInt(compressed + 8, tableLength);
  writeUInt(compressed + 12, nBits);
  writeUInt(compressed + 16, 0);  // room for future extensions

  return dataStart + data_length - compressed;
}